

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaSelect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  vLeaves->nSize = 0;
  for (iVar3 = 0; iVar3 < vCos->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vCos,iVar3);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    Bmc_MnaSelect_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vLeaves);
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0x7fffffffffffffff;
  iVar3 = 0;
  while( true ) {
    if (vNodes->nSize <= iVar3) {
      return;
    }
    iVar1 = Vec_IntEntry(vNodes,iVar3);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0x7fffffffffffffff;
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Bmc_MnaSelect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vLeaves );
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}